

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::MethodOptions::_InternalParse(MethodOptions *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Rep *pRVar4;
  pair<const_char_*,_unsigned_long> pVar5;
  uint uVar6;
  UninterpretedOption *msg;
  char cVar7;
  uint tag;
  unsigned_long extraout_RDX;
  unsigned_long extraout_RDX_00;
  uint32 uVar8;
  uint uVar9;
  char cVar10;
  pair<const_char_*,_unsigned_int> pVar11;
  pair<const_char_*,_unsigned_long> pVar12;
  pair<const_char_*,_unsigned_long> pVar13;
  pair<const_char_*,_bool> pVar14;
  
  uVar9 = 0;
  do {
    if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
      pVar14._8_8_ = 0;
      pVar14.first = ptr;
    }
    else {
      pVar14._8_8_ = 1;
      pVar14.first = ptr;
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        pVar14 = internal::EpsCopyInputStream::DoneFallback
                           (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      }
    }
    ptr = pVar14.first;
    if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    goto LAB_002fdcaa;
    bVar1 = *ptr;
    pVar11.second._0_1_ = bVar1;
    pVar11.first = (char *)((byte *)ptr + 1);
    pVar11._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = ((byte *)ptr)[1];
      uVar8 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar11 = internal::ReadTagFallback(ptr,uVar8);
      }
      else {
        pVar11.second = uVar8;
        pVar11.first = (char *)((byte *)ptr + 2);
        pVar11._12_4_ = 0;
      }
    }
    ptr = pVar11.first;
    cVar10 = '\x04';
    if ((byte *)ptr != (byte *)0x0) {
      tag = pVar11.second;
      uVar6 = (uint)(pVar11._8_8_ >> 3) & 0x1fffffff;
      cVar7 = (char)pVar11.second;
      if (uVar6 == 999) {
        if (cVar7 != ':') goto LAB_002fdb76;
        ptr = (char *)((byte *)ptr + -2);
        do {
          pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar4 == (Rep *)0x0) {
LAB_002fdaf5:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
                       (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002fdb02:
            pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            pRVar4->allocated_size = pRVar4->allocated_size + 1;
            msg = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption>
                            ((this->uninterpreted_option_).super_RepeatedPtrFieldBase.arena_);
            pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            pRVar4->elements[iVar3] = msg;
          }
          else {
            iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar4->allocated_size <= iVar3) {
              if (pRVar4->allocated_size ==
                  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_002fdaf5;
              goto LAB_002fdb02;
            }
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg = (UninterpretedOption *)pRVar4->elements[iVar3];
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption>
                          (ctx,msg,(char *)((byte *)ptr + 2));
          pVar12.second = extraout_RDX;
          pVar12.first = ptr;
          pVar5.second = extraout_RDX;
          pVar5.first = ptr;
          if ((byte *)ptr == (byte *)0x0) goto LAB_002fdc57;
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) &&
                (pVar12 = pVar5, *(short *)ptr == 0x3eba));
LAB_002fdbf3:
        ptr = pVar12.first;
        cVar10 = '\x02';
      }
      else if (uVar6 == 0x22) {
        if (cVar7 != '\x10') goto LAB_002fdb76;
        bVar1 = *ptr;
        pVar12.second = (long)(char)bVar1;
        pVar12.first = (char *)((byte *)ptr + 1);
        if ((long)(char)bVar1 < 0) {
          bVar2 = ((byte *)ptr)[1];
          uVar8 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
          if ((char)bVar2 < '\0') {
            pVar12 = internal::VarintParseSlow64(ptr,uVar8);
          }
          else {
            pVar12.second._0_4_ = uVar8;
            pVar12.first = (char *)((byte *)ptr + 2);
            pVar12.second._4_4_ = 0;
          }
        }
        ptr = pVar12.first;
        if ((byte *)ptr != (byte *)0x0) {
          if ((uint)pVar12.second < 3) {
            *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
            this->idempotency_level_ = (uint)pVar12.second;
          }
          else {
            _InternalParse();
            pVar12.second = extraout_RDX_00;
            pVar12.first = ptr;
          }
          goto LAB_002fdbf3;
        }
      }
      else if ((uVar6 == 0x21) && (cVar7 == '\b')) {
        bVar1 = *ptr;
        pVar13.second = (long)(char)bVar1;
        pVar13.first = (char *)((byte *)ptr + 1);
        if ((long)(char)bVar1 < 0) {
          bVar2 = ((byte *)ptr)[1];
          uVar8 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
          if ((char)bVar2 < '\0') {
            pVar13 = internal::VarintParseSlow64(ptr,uVar8);
          }
          else {
            pVar13.second._0_4_ = uVar8;
            pVar13.first = (char *)((byte *)ptr + 2);
            pVar13.second._4_4_ = 0;
          }
        }
        ptr = pVar13.first;
        this->deprecated_ = pVar13.second != 0;
        cVar10 = ((byte *)ptr == (byte *)0x0) * '\x02' + '\x02';
        uVar9 = 1;
      }
      else {
LAB_002fdb76:
        if (tag == 0 || (tag & 7) == 4) {
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
          cVar10 = '\t';
        }
        else {
          if (tag < 8000) {
            ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr,ctx);
          }
          else {
            ptr = internal::ExtensionSet::ParseField
                            (&this->_extensions_,pVar11._8_8_ & 0xffffffff,ptr,
                             (Message *)_MethodOptions_default_instance_,&this->_internal_metadata_,
                             ctx);
          }
          cVar10 = ((byte *)ptr == (byte *)0x0) * '\x02' + '\x02';
        }
      }
    }
LAB_002fdc57:
  } while (cVar10 == '\x02');
  if (cVar10 == '\x04') {
    ptr = (char *)0x0;
  }
LAB_002fdcaa:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar9;
  return (char *)(byte *)ptr;
}

Assistant:

const char* MethodOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional bool deprecated = 33 [default = false];
      case 33:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.MethodOptions.IdempotencyLevel idempotency_level = 34 [default = IDEMPOTENCY_UNKNOWN];
      case 34:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(PROTOBUF_NAMESPACE_ID::MethodOptions_IdempotencyLevel_IsValid(val))) {
            _internal_set_idempotency_level(static_cast<PROTOBUF_NAMESPACE_ID::MethodOptions_IdempotencyLevel>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(34, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}